

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector_test.cpp
# Opt level: O0

void __thiscall
adt_vector_test_DefaultConstructor_Test::TestBody(adt_vector_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined8 *puVar3;
  AssertionResult gtest_ar_3;
  size_t current;
  size_t i_1;
  AssertionResult gtest_ar_2;
  size_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector v;
  unsigned_long *in_stack_fffffffffffffea0;
  unsigned_long *in_stack_fffffffffffffea8;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  AssertHelper local_100;
  Message local_f8;
  ulong local_f0;
  undefined8 local_e8;
  AssertionResult local_e0;
  undefined8 local_d0;
  ulong local_c8;
  AssertHelper local_c0;
  Message local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  AssertionResult local_a0;
  ulong local_90;
  AssertHelper local_88;
  Message local_80;
  undefined8 local_78;
  undefined8 local_70;
  AssertionResult local_68;
  uint local_54;
  AssertHelper local_50;
  Message local_48 [3];
  undefined8 local_30;
  undefined8 local_28;
  AssertionResult local_20;
  undefined8 local_10;
  
  local_10 = vector_create_reserve(8,0x32);
  local_28 = vector_type_size(local_10);
  local_30 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10a9eb);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x10aa48);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aab6);
  if (local_54 == 0) {
    local_70 = vector_size(local_10);
    local_78 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffeb8,
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ab7f);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
                 ,0x25,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message((Message *)0x10abdc);
    }
    local_54 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ac47);
    if (local_54 == 0) {
      for (local_90 = 0; local_90 < 0x32; local_90 = local_90 + 1) {
        vector_push_back(local_10,&local_90);
      }
      local_a8 = vector_size(local_10);
      local_b0 = 0x32;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_stack_fffffffffffffeb8,
                 (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
      if (!bVar1) {
        testing::Message::Message(&local_b8);
        in_stack_fffffffffffffeb8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x10ad52);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
                   ,0x2c,in_stack_fffffffffffffeb8);
        testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        testing::Message::~Message((Message *)0x10adaf);
      }
      local_54 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ae1d);
      if (local_54 == 0) {
        for (local_c8 = 0; local_c8 < 0x32; local_c8 = local_c8 + 1) {
          puVar3 = (undefined8 *)vector_at(local_10,local_c8);
          local_e8 = *puVar3;
          local_f0 = local_c8;
          this_00 = &local_e0;
          local_d0 = local_e8;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    (in_stack_fffffffffffffeb8,
                     (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     (unsigned_long *)this_00,in_stack_fffffffffffffea0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
          in_stack_fffffffffffffeb7 = bVar1;
          if (!bVar1) {
            testing::Message::Message(&local_f8);
            in_stack_fffffffffffffea0 =
                 (unsigned_long *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x10af17);
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
                       ,0x32,(char *)in_stack_fffffffffffffea0);
            testing::internal::AssertHelper::operator=(&local_100,&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            testing::Message::~Message((Message *)0x10af65);
          }
          local_54 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10afca);
          if (local_54 != 0) {
            return;
          }
        }
        vector_destroy(local_10);
      }
    }
  }
  return;
}

Assistant:

TEST_F(adt_vector_test, DefaultConstructor)
{
	static const size_t capacity = 50;

	vector v = vector_create_reserve_type(size_t, capacity);

	ASSERT_EQ((size_t)vector_type_size(v), (size_t)sizeof(size_t));
	ASSERT_EQ((size_t)vector_size(v), (size_t)0);

	for (size_t i = 0; i < capacity; ++i)
	{
		vector_push_back_var(v, i);
	}

	ASSERT_EQ((size_t)vector_size(v), (size_t)capacity);

	for (size_t i = 0; i < capacity; ++i)
	{
		size_t current = vector_at_type(v, i, size_t);

		ASSERT_EQ((size_t)current, (size_t)i);
	}

	vector_destroy(v);
}